

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

string * __thiscall
gflags::anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *flagval,
          FlagSettingMode set_mode,bool errors_are_fatal)

{
  char *name;
  bool bVar1;
  CommandLineFlag *flag;
  mapped_type *pmVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_register_00000081;
  ulong uVar4;
  string envval;
  string envname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flaglist;
  allocator local_132;
  allocator local_131;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_130;
  CommandLineFlagParser *local_128;
  FlagSettingMode local_120;
  undefined4 local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b8;
  long local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  key_type local_90;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_11c = (undefined4)CONCAT71(in_register_00000081,errors_are_fatal);
  local_128 = this;
  local_120 = set_mode;
  if (flagval->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_d8);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ParseFlagList((flagval->_M_dataplus)._M_p,&local_a8);
    local_130 = &local_128->error_flags_;
    local_b8 = &local_128->undefined_names_;
    lVar3 = 0;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)local_a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
      name = *(char **)((long)&((local_a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar3);
      local_b0 = lVar3;
      flag = FlagRegistry::FindFlagLocked(local_128->registry_,name);
      if (flag == (CommandLineFlag *)0x0) {
        StringPrintf_abi_cxx11_
                  (&local_d8,"%sunknown command line flag \'%s\' (via --fromenv or --tryfromenv)\n",
                   "ERROR: ",name);
        std::__cxx11::string::string((string *)&local_118,name,(allocator *)&local_f8);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_130,&local_118);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::string((string *)&local_d8,name,(allocator *)&local_118);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_b8,&local_d8);
        std::__cxx11::string::assign((char *)pmVar2);
      }
      else {
        std::__cxx11::string::string((string *)&local_118,"FLAGS_",(allocator *)&local_90);
        std::__cxx11::string::string((string *)&local_f8,name,(allocator *)&local_50);
        std::operator+(&local_d8,&local_118,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
        bVar1 = SafeGetEnv(local_d8._M_dataplus._M_p,&local_118);
        if (bVar1) {
          bVar1 = std::operator==(&local_118,"fromenv");
          if (bVar1) {
LAB_0013de79:
            StringPrintf_abi_cxx11_
                      (&local_f8,"%sinfinite recursion on environment flag \'%s\'\n","ERROR: ",
                       local_118._M_dataplus._M_p);
            std::__cxx11::string::string((string *)&local_90,name,(allocator *)&local_50);
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](local_130,&local_90);
            std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_90);
          }
          else {
            bVar1 = std::operator==(&local_118,"tryfromenv");
            if (bVar1) goto LAB_0013de79;
            (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                      (&local_f8,local_128,flag,local_118._M_dataplus._M_p,local_120);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          this_00 = &local_f8;
LAB_0013e03d:
          std::__cxx11::string::~string((string *)this_00);
        }
        else if ((char)local_11c != '\0') {
          std::__cxx11::string::string((string *)&local_50,"ERROR: ",&local_131);
          std::operator+(&local_90,&local_50,&local_d8);
          std::operator+(&local_f8,&local_90," not found in environment\n");
          std::__cxx11::string::string((string *)&local_70,name,&local_132);
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_130,&local_70);
          std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_90);
          this_00 = &local_50;
          goto LAB_0013e03d;
        }
        std::__cxx11::string::~string((string *)&local_118);
      }
      std::__cxx11::string::~string((string *)&local_d8);
      lVar3 = local_b0 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

string CommandLineFlagParser::ProcessFromenvLocked(const string& flagval,
                                                   FlagSettingMode set_mode,
                                                   bool errors_are_fatal) {
  if (flagval.empty())
    return "";

  string msg;
  vector<string> flaglist;
  ParseFlagList(flagval.c_str(), &flaglist);

  for (size_t i = 0; i < flaglist.size(); ++i) {
    const char* flagname = flaglist[i].c_str();
    CommandLineFlag* flag = registry_->FindFlagLocked(flagname);
    if (flag == NULL) {
      error_flags_[flagname] =
          StringPrintf("%sunknown command line flag '%s' "
                       "(via --fromenv or --tryfromenv)\n",
                       kError, flagname);
      undefined_names_[flagname] = "";
      continue;
    }

    const string envname = string("FLAGS_") + string(flagname);
    string envval;
    if (!SafeGetEnv(envname.c_str(), envval)) {
      if (errors_are_fatal) {
        error_flags_[flagname] = (string(kError) + envname +
                                  " not found in environment\n");
      }
      continue;
    }

    // Avoid infinite recursion.
    if (envval == "fromenv" || envval == "tryfromenv") {
      error_flags_[flagname] =
          StringPrintf("%sinfinite recursion on environment flag '%s'\n",
                       kError, envval.c_str());
      continue;
    }

    msg += ProcessSingleOptionLocked(flag, envval.c_str(), set_mode);
  }
  return msg;
}